

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O1

int str_comp_filenames(char *a,char *b)

{
  char *pcVar1;
  char *pcVar2;
  char cVar3;
  int iVar4;
  __int32_t **pp_Var5;
  
  cVar3 = *a;
  for (; (cVar3 != '\0' && (*b != '\0')); b = b + 1) {
    if (((byte)(cVar3 - 0x30U) < 10) && ((byte)(*b - 0x30U) < 10)) {
      iVar4 = 0;
      pcVar1 = a;
      pcVar2 = b;
      do {
        b = pcVar2 + 1;
        a = pcVar1 + 1;
        if (iVar4 == 0) {
          iVar4 = (int)*pcVar1 - (int)*pcVar2;
        }
        if (9 < (byte)(*a - 0x30U)) goto LAB_001451fe;
        pcVar1 = a;
        pcVar2 = b;
      } while ((byte)(*b - 0x30U) < 10);
      if ((byte)(*a - 0x30U) < 10) {
        return 1;
      }
LAB_001451fe:
      if ((byte)(*b - 0x30U) < 10) {
        return -1;
      }
      if (iVar4 != 0) {
        return iVar4;
      }
    }
    pp_Var5 = __ctype_tolower_loc();
    if ((*pp_Var5)[*a] != (*pp_Var5)[*b]) break;
    cVar3 = a[1];
    a = a + 1;
  }
  pp_Var5 = __ctype_tolower_loc();
  return (*pp_Var5)[*a] - (*pp_Var5)[*b];
}

Assistant:

int str_comp_filenames(const char *a, const char *b)
{
	int result;

	for(; *a && *b; ++a, ++b)
	{
		if(*a >= '0' && *a <= '9' && *b >= '0' && *b <= '9')
		{
			result = 0;
			do
			{
				if(!result)
					result = *a - *b;
				++a; ++b;
			}
			while(*a >= '0' && *a <= '9' && *b >= '0' && *b <= '9');

			if(*a >= '0' && *a <= '9')
				return 1;
			else if(*b >= '0' && *b <= '9')
				return -1;
			else if(result)
				return result;
		}

		if(tolower(*a) != tolower(*b))
			break;
	}
	return tolower(*a) - tolower(*b);
}